

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteQuotedData(WatWriter *this,void *data,size_t length)

{
  byte bVar1;
  Stream *this_00;
  size_t sVar2;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  
  WriteNextChar(this);
  local_32 = 0x22;
  Stream::WriteData(this->stream_,&local_32,1,(char *)0x0,No);
  if (length != 0) {
    sVar2 = 0;
    do {
      bVar1 = *(byte *)((long)data + sVar2);
      this_00 = this->stream_;
      if ((anonymous_namespace)::s_is_char_escaped[bVar1] != '\0') {
        local_31 = 0x5c;
        Stream::WriteData(this_00,&local_31,1,(char *)0x0,No);
        Stream::WriteU8(this->stream_,(int)"0123456789abcdef"[bVar1 >> 4],(char *)0x0,No);
        bVar1 = "0123456789abcdef"[bVar1 & 0xf];
        this_00 = this->stream_;
      }
      Stream::WriteU8(this_00,(int)(char)bVar1,(char *)0x0,No);
      sVar2 = sVar2 + 1;
    } while (length != sVar2);
  }
  local_33 = 0x22;
  Stream::WriteData(this->stream_,&local_33,1,(char *)0x0,No);
  this->next_char_ = Space;
  return;
}

Assistant:

void WatWriter::WriteQuotedData(const void* data, size_t length) {
  const uint8_t* u8_data = static_cast<const uint8_t*>(data);
  static const char s_hexdigits[] = "0123456789abcdef";
  WriteNextChar();
  WritePutc('\"');
  for (size_t i = 0; i < length; ++i) {
    uint8_t c = u8_data[i];
    if (s_is_char_escaped[c]) {
      WritePutc('\\');
      WritePutc(s_hexdigits[c >> 4]);
      WritePutc(s_hexdigits[c & 0xf]);
    } else {
      WritePutc(c);
    }
  }
  WritePutc('\"');
  next_char_ = NextChar::Space;
}